

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitReplaceLaneExpr
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature)

{
  code *pcVar1;
  bool bVar2;
  RegSlot location_;
  undefined4 *puVar3;
  WasmRegisterSpace *this_00;
  EmitInfo EStack_48;
  RegSlot resultReg;
  EmitInfo indexInfo;
  EmitInfo simdArg;
  EmitInfo valueArg;
  WasmType valueType;
  WasmType resultType;
  WasmType *signature_local;
  OpCodeAsmJs op_local;
  WasmBytecodeGenerator *this_local;
  EmitInfo result;
  
  valueArg.type = *signature;
  valueArg.super_EmitInfoBase.location = signature[1];
  simdArg = PopEvalStack(this,valueArg.super_EmitInfoBase.location,L"lane argument type mismatch");
  indexInfo = PopEvalStack(this,V128,L"simd argument type mismatch");
  if (valueArg.type != V128) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x5fa,"(resultType == WasmTypes::V128)","resultType == WasmTypes::V128");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  EStack_48 = EmitLaneIndex(this,op);
  this_00 = GetRegisterSpace(this,valueArg.type);
  location_ = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  EmitInfo::EmitInfo((EmitInfo *)&this_local,location_,&valueArg.type);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x11])
            (this->m_writer,(ulong)op,(ulong)location_,(ulong)indexInfo & 0xffffffff,
             (ulong)EStack_48 & 0xffffffff,(ulong)simdArg & 0xffffffff);
  ReleaseLocation(this,&stack0xffffffffffffffb8);
  ReleaseLocation(this,&simdArg);
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitReplaceLaneExpr(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature) {

    const WasmTypes::WasmType resultType = signature[0];
    const WasmTypes::WasmType valueType = signature[1];
    EmitInfo valueArg = PopEvalStack(valueType, _u("lane argument type mismatch"));

    EmitInfo simdArg = PopEvalStack(WasmTypes::V128, _u("simd argument type mismatch"));
    Assert(resultType == WasmTypes::V128);

    EmitInfo indexInfo = EmitLaneIndex(op);
    Js::RegSlot resultReg = GetRegisterSpace(resultType)->AcquireTmpRegister();
    EmitInfo result(resultReg, resultType);

    m_writer->AsmReg4(op, resultReg, simdArg.location, indexInfo.location, valueArg.location);
    ReleaseLocation(&indexInfo);
    ReleaseLocation(&valueArg);
    return result;
}